

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_lattice_t * ps_lattice_read(ps_decoder_t *ps,char *file)

{
  int iVar1;
  int32 iVar2;
  s3wid_t sVar3;
  int iVar4;
  dict_t *pdVar5;
  logmath_t *plVar6;
  long lVar7;
  listelem_alloc_t *plVar8;
  ps_latnode_t *ppVar9;
  float64 fVar10;
  double dVar11;
  double dVar12;
  s3wid_t local_1d4;
  ps_latnode_t *d;
  ps_latnode_t *pd;
  int local_1b0;
  int ascr;
  int to;
  int from;
  char *ww;
  ps_latnode_t *node;
  char wd [256];
  int32 local_90;
  int32 local_8c;
  int lef;
  int fef;
  int sf;
  int seqid;
  int32 w;
  float32 pb;
  ps_latnode_t **pnodes;
  int32 fillpen;
  int32 silpen;
  int32 pip;
  int n_nodes;
  int k;
  int i;
  ps_lattice_t *dag;
  ps_latnode_t **darray;
  float64 fStack_40;
  float32 logratio;
  float64 lb;
  lineiter_t *line;
  FILE *pFStack_28;
  int32 ispipe;
  FILE *fp;
  char *file_local;
  ps_decoder_t *ps_local;
  
  fp = (FILE *)file;
  file_local = (char *)ps;
  _k = (ps_lattice_t *)
       __ckd_calloc__(1,0x80,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                      ,0x192);
  if (file_local == (char *)0x0) {
    pdVar5 = dict_init((ps_config_t *)0x0,(bin_mdef_t *)0x0);
    _k->dict = pdVar5;
    plVar6 = logmath_init(1.0001,0,0);
    _k->lmath = plVar6;
    _k->frate = 100;
  }
  else {
    _k->search = *(ps_search_t **)(file_local + 0x38);
    pdVar5 = dict_retain(*(dict_t **)(file_local + 0x18));
    _k->dict = pdVar5;
    plVar6 = logmath_retain(*(logmath_t **)(file_local + 0x28));
    _k->lmath = plVar6;
    lVar7 = ps_config_int(_k->search->config,"frate");
    _k->frate = (int32)lVar7;
  }
  _k->silence = _k->dict->silwid;
  plVar8 = listelem_alloc_init(0x48);
  _k->latnode_alloc = plVar8;
  plVar8 = listelem_alloc_init(0x30);
  _k->latlink_alloc = plVar8;
  plVar8 = listelem_alloc_init(0x10);
  _k->latlink_list_alloc = plVar8;
  _k->refcount = 1;
  dag = (ps_lattice_t *)0x0;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0x1a7,"Reading DAG file: %s\n",fp);
  pFStack_28 = fopen_compchk((char *)fp,(int32 *)((long)&line + 4));
  if (pFStack_28 == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                   ,0x1a9,"Failed to open DAG file \'%s\' for reading",fp);
  }
  else {
    lb = (float64)lineiter_start(pFStack_28);
    if ((lineiter_t *)lb == (lineiter_t *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
              ,0x1b0,"Premature EOF(%s)\n",fp);
    }
    else {
      iVar1 = strncmp(((lineiter_t *)lb)->buf,"# getcwd: ",10);
      if (iVar1 == 0) {
        lb = (float64)lineiter_next((lineiter_t *)lb);
        if ((lineiter_t *)lb == (lineiter_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,0x1b8,"Premature EOF(%s)\n",fp);
        }
        else {
          iVar1 = strncmp(((lineiter_t *)lb)->buf,"# -logbase ",0xb);
          if ((iVar1 != 0) ||
             (iVar1 = __isoc99_sscanf(*(long *)lb + 0xb,"%lf",&stack0xffffffffffffffc0), iVar1 != 1)
             ) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                    ,0x1bd,"%s: Cannot find -logbase in header\n",fp);
            fStack_40 = 1.0001;
          }
          darray._4_4_ = 1.0;
          if (_k->lmath == (logmath_t *)0x0) {
            plVar6 = logmath_init(fStack_40,0,1);
            _k->lmath = plVar6;
          }
          else {
            fVar10 = logmath_get_base(_k->lmath);
            seqid = (int)(float)(double)fVar10;
            if (0.0001 <= ABS((double)fStack_40 - (double)(float)seqid)) {
              err_msg(ERR_WARN,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                      ,0x1c6,"Inconsistent logbases: %f vs %f: will compensate\n",fStack_40,
                      SUB84((double)(float)seqid,0));
              dVar12 = log((double)fStack_40);
              dVar11 = log((double)(float)seqid);
              darray._4_4_ = (float)(dVar12 / dVar11);
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                      ,0x1c8,"Lattice log ratio: %f\n",(double)darray._4_4_);
            }
          }
          iVar1 = dag_param_read((lineiter_t *)lb,"Frames");
          _k->n_frames = iVar1;
          if (_k->n_frames < 1) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                    ,0x1ce,"Frames parameter missing or invalid\n");
          }
          else {
            silpen = dag_param_read((lineiter_t *)lb,"Nodes");
            if (silpen < 1) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                      ,0x1d4,"Nodes parameter missing or invalid\n");
            }
            else {
              dag = (ps_lattice_t *)
                    __ckd_calloc__((long)silpen,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                   ,0x1d9);
              _w = &_k->nodes;
              for (n_nodes = 0; n_nodes < silpen; n_nodes = n_nodes + 1) {
                lb = (float64)lineiter_next((lineiter_t *)lb);
                if ((lineiter_t *)lb == (lineiter_t *)0x0) {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                          ,0x1e2,"Premature EOF while loading Nodes(%s)\n",fp);
                  goto LAB_0011384a;
                }
                pip = __isoc99_sscanf(((lineiter_t *)lb)->buf,"%d %255s %d %d %d",&fef,&node,&lef,
                                      &local_8c,&local_90);
                if (pip != 5) {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                          ,0x1e9,"Cannot parse line: %s, value of count %d\n",*(undefined8 *)lb,
                          (ulong)(uint)pip);
                  goto LAB_0011384a;
                }
                sf = dict_wordid(_k->dict,(char *)&node);
                if (sf < 0) {
                  if (_k->search == (ps_search_t *)0x0) {
                    _to = __ckd_salloc__((char *)&node,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                         ,0x1f0);
                    iVar2 = dict_word2basestr(_to);
                    if ((iVar2 != -1) && (sVar3 = dict_wordid(_k->dict,_to), sVar3 == -1)) {
                      dict_add_word(_k->dict,_to,(s3cipid_t *)0x0,0);
                    }
                    ckd_free(_to);
                    sf = dict_add_word(_k->dict,(char *)&node,(s3cipid_t *)0x0,0);
                  }
                  if (sf < 0) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                            ,0x1f9,"Unknown word in line: %s\n",*(undefined8 *)lb);
                    goto LAB_0011384a;
                  }
                }
                if (fef != n_nodes) {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                          ,0x1ff,"Seqno error: %s\n",*(undefined8 *)lb);
                  goto LAB_0011384a;
                }
                ppVar9 = (ps_latnode_t *)
                         __listelem_malloc__(_k->latnode_alloc,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                             ,0x203);
                *_w = ppVar9;
                ww = (char *)*_w;
                *(char **)(&dag->refcount + (long)n_nodes * 2) = ww;
                ((ps_latnode_t *)ww)->wid = sf;
                ((ps_latnode_t *)ww)->basewid = _k->dict->word[sf].basewid;
                ((ps_latnode_t *)ww)->id = fef;
                ((ps_latnode_t *)ww)->sf = lef;
                ((ps_latnode_t *)ww)->fef = local_8c;
                ((ps_latnode_t *)ww)->lef = local_90;
                ((ps_latnode_t *)ww)->reachable = 0;
                ((ps_latnode_t *)ww)->entries = (latlink_list_t *)0x0;
                ((ps_latnode_t *)ww)->exits = (latlink_list_t *)0x0;
                ((ps_latnode_t *)ww)->next = (ps_latnode_s *)0x0;
                _w = &((ps_latnode_t *)ww)->next;
              }
              pip = dag_param_read((lineiter_t *)lb,"Initial");
              if ((pip < 0) || (silpen <= pip)) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0x215,"Initial node parameter missing or invalid\n");
              }
              else {
                _k->start = *(ps_latnode_t **)(&dag->refcount + (long)pip * 2);
                pip = dag_param_read((lineiter_t *)lb,"Final");
                if ((pip < 0) || (silpen <= pip)) {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                          ,0x21d,"Final node parameter missing or invalid\n");
                }
                else {
                  _k->end = *(ps_latnode_t **)(&dag->refcount + (long)pip * 2);
                  pip = dag_param_read((lineiter_t *)lb,"BestSegAscr");
                  if (pip < 0) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                            ,0x224,"BestSegAscr parameter missing\n");
                  }
                  else {
                    for (n_nodes = 0; n_nodes < pip; n_nodes = n_nodes + 1) {
                      lb = (float64)lineiter_next((lineiter_t *)lb);
                      if ((lineiter_t *)lb == (lineiter_t *)0x0) {
                        err_msg(ERR_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                ,0x22a,"Premature EOF while (%s) ignoring BestSegAscr\n",0);
                        goto LAB_0011384a;
                      }
                    }
                    do {
                      lb = (float64)lineiter_next((lineiter_t *)lb);
                      if ((lineiter_t *)lb == (lineiter_t *)0x0) break;
                    } while ((*((lineiter_t *)lb)->buf == '#') ||
                            (iVar1 = strncmp(((lineiter_t *)lb)->buf,"Edges",5), iVar1 != 0));
                    if (lb == 0.0) {
                      err_msg(ERR_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                              ,0x237,"Edges missing\n");
                    }
                    else {
                      while ((lb = (float64)lineiter_next((lineiter_t *)lb),
                             (lineiter_t *)lb != (lineiter_t *)0x0 &&
                             (iVar1 = __isoc99_sscanf(((lineiter_t *)lb)->buf,"%d %d %d",&ascr,
                                                      &local_1b0,(long)&pd + 4), iVar1 == 3))) {
                        if (-0x20000001 < pd._4_4_) {
                          if ((darray._4_4_ != 1.0) || (NAN(darray._4_4_))) {
                            pd._4_4_ = (int)((float)pd._4_4_ * darray._4_4_);
                          }
                          ps_lattice_link(_k,*(ps_latnode_t **)(&dag->refcount + (long)ascr * 2),
                                          *(ps_latnode_t **)(&dag->refcount + (long)local_1b0 * 2),
                                          pd._4_4_,(*(ps_latnode_t **)
                                                     (&dag->refcount + (long)local_1b0 * 2))->sf +
                                                   -1);
                        }
                      }
                      iVar1 = strcmp(*(char **)lb,"End\n");
                      if (iVar1 == 0) {
                        lineiter_free((lineiter_t *)lb);
                        fclose_comp(pFStack_28,line._4_4_);
                        ckd_free(dag);
                        iVar1 = dict_filler_word(_k->dict,_k->end->wid);
                        if (iVar1 != 0) {
                          if (_k->search == (ps_search_t *)0x0) {
                            local_1d4 = dict_wordid(_k->dict,"</s>");
                          }
                          else {
                            local_1d4 = _k->search->finish_wid;
                          }
                          _k->end->basewid = local_1d4;
                        }
                        dag_mark_reachable(_k->end);
                        ps_lattice_delete_unreachable(_k);
                        if (file_local != (char *)0x0) {
                          plVar6 = _k->lmath;
                          dVar12 = ps_config_float(*(ps_config_t **)file_local,"pip");
                          iVar1 = logmath_log(plVar6,(float64)dVar12);
                          plVar6 = _k->lmath;
                          fillpen = iVar1;
                          dVar12 = ps_config_float(*(ps_config_t **)file_local,"silprob");
                          iVar4 = logmath_log(plVar6,(float64)dVar12);
                          iVar2 = fillpen;
                          pnodes._4_4_ = iVar1 + iVar4;
                          plVar6 = _k->lmath;
                          dVar12 = ps_config_float(*(ps_config_t **)file_local,"fillprob");
                          iVar1 = logmath_log(plVar6,(float64)dVar12);
                          pnodes._0_4_ = iVar2 + iVar1;
                          ps_lattice_penalize_fillers(_k,pnodes._4_4_,(int)pnodes);
                        }
                        return _k;
                      }
                      err_msg(ERR_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                              ,0x24a,"Terminating \'End\' missing\n");
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                ,0x1b4,"%s does not begin with \'# getcwd: \'\n%s",fp,*(undefined8 *)lb);
      }
    }
LAB_0011384a:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x26f,"Failed to load %s\n",fp);
    lineiter_free((lineiter_t *)lb);
    fclose_comp(pFStack_28,line._4_4_);
    ckd_free(dag);
  }
  return (ps_lattice_t *)0x0;
}

Assistant:

ps_lattice_t *
ps_lattice_read(ps_decoder_t *ps,
                char const *file)
{
    FILE *fp;
    int32 ispipe;
    lineiter_t *line;
    float64 lb;
    float32 logratio;
    ps_latnode_t **darray;
    ps_lattice_t *dag;
    int i, k, n_nodes;
    int32 pip, silpen, fillpen;
    ps_latnode_t **pnodes;

    dag = ckd_calloc(1, sizeof(*dag));

    if (ps) {
        dag->search = ps->search;
        dag->dict = dict_retain(ps->dict);
        dag->lmath = logmath_retain(ps->lmath);
        dag->frate = ps_config_int(dag->search->config, "frate");
    }
    else {
        dag->dict = dict_init(NULL, NULL);
        dag->lmath = logmath_init(1.0001, 0, FALSE);
        dag->frate = 100;
    }
    dag->silence = dict_silwid(dag->dict);
    dag->latnode_alloc = listelem_alloc_init(sizeof(ps_latnode_t));
    dag->latlink_alloc = listelem_alloc_init(sizeof(ps_latlink_t));
    dag->latlink_list_alloc = listelem_alloc_init(sizeof(latlink_list_t));
    dag->refcount = 1;

    darray = NULL;

    E_INFO("Reading DAG file: %s\n", file);
    if ((fp = fopen_compchk(file, &ispipe)) == NULL) {
        E_ERROR_SYSTEM("Failed to open DAG file '%s' for reading", file);
        return NULL;
    }
    line = lineiter_start(fp);

    /* Read and verify logbase (ONE BIG HACK!!) */
    if (line == NULL) {
        E_ERROR("Premature EOF(%s)\n", file);
        goto load_error;
    }
    if (strncmp(line->buf, "# getcwd: ", 10) != 0) {
        E_ERROR("%s does not begin with '# getcwd: '\n%s", file, line->buf);
        goto load_error;
    }
    if ((line = lineiter_next(line)) == NULL) {
        E_ERROR("Premature EOF(%s)\n", file);
        goto load_error;
    }
    if ((strncmp(line->buf, "# -logbase ", 11) != 0)
        || (sscanf(line->buf + 11, "%lf", &lb) != 1)) {
        E_WARN("%s: Cannot find -logbase in header\n", file);
        lb = 1.0001;
    }
    logratio = 1.0f;
    if (dag->lmath == NULL)
        dag->lmath = logmath_init(lb, 0, TRUE);
    else {
        float32 pb = logmath_get_base(dag->lmath);
        if (fabs(lb - pb) >= 0.0001) {
            E_WARN("Inconsistent logbases: %f vs %f: will compensate\n", lb, pb);
            logratio = (float32)(log(lb) / log(pb));
            E_INFO("Lattice log ratio: %f\n", logratio);
        }
    }
    /* Read Frames parameter */
    dag->n_frames = dag_param_read(line, "Frames");
    if (dag->n_frames <= 0) {
        E_ERROR("Frames parameter missing or invalid\n");
        goto load_error;
    }
    /* Read Nodes parameter */
    n_nodes = dag_param_read(line, "Nodes");
    if (n_nodes <= 0) {
        E_ERROR("Nodes parameter missing or invalid\n");
        goto load_error;
    }

    /* Read nodes */
    darray = ckd_calloc(n_nodes, sizeof(*darray));
    pnodes = &dag->nodes;
    for (i = 0; i < n_nodes; i++) {
        int32 w;
        int seqid, sf, fef, lef;
        char wd[256];
        ps_latnode_t *node;

        if ((line = lineiter_next(line)) == NULL) {
            E_ERROR("Premature EOF while loading Nodes(%s)\n", file);
            goto load_error;
        }

        if ((k =
             sscanf(line->buf, "%d %255s %d %d %d", &seqid, wd, &sf, &fef,
                    &lef)) != 5) {
            E_ERROR("Cannot parse line: %s, value of count %d\n", line->buf, k);
            goto load_error;
        }

        w = dict_wordid(dag->dict, wd);
        if (w < 0) {
            if (dag->search == NULL) {
                char *ww = ckd_salloc(wd);
                if (dict_word2basestr(ww) != -1) {
                    if (dict_wordid(dag->dict, ww) == BAD_S3WID)
                        dict_add_word(dag->dict, ww, NULL, 0);
                }
                ckd_free(ww);
                w = dict_add_word(dag->dict, wd, NULL, 0);
            }
            if (w < 0) {
                E_ERROR("Unknown word in line: %s\n", line->buf);
                goto load_error;
            }
        }

        if (seqid != i) {
            E_ERROR("Seqno error: %s\n", line->buf);
            goto load_error;
        }

        *pnodes = listelem_malloc(dag->latnode_alloc);
        node = *pnodes;
        darray[i] = node;
        node->wid = w;
        node->basewid = dict_basewid(dag->dict, w);
        node->id = seqid;
        node->sf = sf;
        node->fef = fef;
        node->lef = lef;
        node->reachable = 0;
        node->exits = node->entries = NULL;
        node->next = NULL;
        pnodes = &node->next;
    }

    /* Read initial node ID */
    k = dag_param_read(line, "Initial");
    if ((k < 0) || (k >= n_nodes)) {
        E_ERROR("Initial node parameter missing or invalid\n");
        goto load_error;
    }
    dag->start = darray[k];

    /* Read final node ID */
    k = dag_param_read(line, "Final");
    if ((k < 0) || (k >= n_nodes)) {
        E_ERROR("Final node parameter missing or invalid\n");
        goto load_error;
    }
    dag->end = darray[k];

    /* Read bestsegscore entries and ignore them. */
    if ((k = dag_param_read(line, "BestSegAscr")) < 0) {
        E_ERROR("BestSegAscr parameter missing\n");
        goto load_error;
    }
    for (i = 0; i < k; i++) {
        if ((line = lineiter_next(line)) == NULL) {
            E_ERROR("Premature EOF while (%s) ignoring BestSegAscr\n",
                    line);
            goto load_error;
        }
    }

    /* Read in edges. */
    while ((line = lineiter_next(line)) != NULL) {
        if (line->buf[0] == '#')
            continue;
        if (0 == strncmp(line->buf, "Edges", 5))
            break;
    }
    if (line == NULL) {
        E_ERROR("Edges missing\n");
        goto load_error;
    }
    while ((line = lineiter_next(line)) != NULL) {
        int from, to, ascr;
        ps_latnode_t *pd, *d;

        if (sscanf(line->buf, "%d %d %d", &from, &to, &ascr) != 3)
            break;
        if (ascr WORSE_THAN WORST_SCORE)
            continue;
        pd = darray[from];
        d = darray[to];
        if (logratio != 1.0f)
            /* FIXME: possible under/overflow!!! */
            ascr = (int32)(ascr * logratio);
        ps_lattice_link(dag, pd, d, ascr, d->sf - 1);
    }
    if (strcmp(line->buf, "End\n") != 0) {
        E_ERROR("Terminating 'End' missing\n");
        goto load_error;
    }
    lineiter_free(line);
    fclose_comp(fp, ispipe);
    ckd_free(darray);

    /* Minor hack: If the final node is a filler word and not </s>,
     * then set its base word ID to </s>, so that the language model
     * scores won't be screwed up. */
    if (dict_filler_word(dag->dict, dag->end->wid))
        dag->end->basewid = dag->search
            ? ps_search_finish_wid(dag->search)
            : dict_wordid(dag->dict, S3_FINISH_WORD);

    /* Mark reachable from dag->end */
    dag_mark_reachable(dag->end);

    /* Free nodes unreachable from dag->end and their links */
    ps_lattice_delete_unreachable(dag);

    if (ps) {
        /* Build links around silence and filler words, since they do
         * not exist in the language model.  FIXME: This is
         * potentially buggy, as we already do this before outputting
         * lattices. */
        pip = logmath_log(dag->lmath, ps_config_float(ps->config, "pip"));
        silpen = pip + logmath_log(dag->lmath,
                                   ps_config_float(ps->config, "silprob"));
        fillpen = pip + logmath_log(dag->lmath,
                                    ps_config_float(ps->config, "fillprob"));
        ps_lattice_penalize_fillers(dag, silpen, fillpen);
    }

    return dag;

  load_error:
    E_ERROR("Failed to load %s\n", file);
    lineiter_free(line);
    fclose_comp(fp, ispipe);
    ckd_free(darray);
    return NULL;
}